

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderRemoveNode(ImGuiID node_id)

{
  byte *pbVar1;
  ImGuiContext *ctx;
  ImGuiDockNode *node;
  bool clear_settings_refs;
  
  ctx = GImGui;
  node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,node_id);
  if (node != (ImGuiDockNode *)0x0) {
    DockBuilderRemoveNodeDockedWindows((ImGui *)(ulong)node_id,1,clear_settings_refs);
    DockBuilderRemoveNodeChildNodes(node_id);
    if (((node->LocalFlags & 0x800) != 0) && (node->ParentNode != (ImGuiDockNode *)0x0)) {
      pbVar1 = (byte *)((long)&node->ParentNode->LocalFlags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    DockContextRemoveNode(ctx,node,true);
    return;
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNode(ImGuiID node_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    DockBuilderRemoveNodeDockedWindows(node_id, true);
    DockBuilderRemoveNodeChildNodes(node_id);
    if (node->IsCentralNode() && node->ParentNode)
        node->ParentNode->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
    DockContextRemoveNode(ctx, node, true);
}